

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O1

qsbr_epoch __thiscall
unodb::qsbr::change_epoch(qsbr *this,qsbr_epoch current_global_epoch,bool single_thread_mode)

{
  bool bVar1;
  bool bVar2;
  undefined8 in_RAX;
  type tVar3;
  __int_type _Var4;
  __int_type word;
  byte unaff_R13B;
  undefined8 uStack_38;
  qsbr_epoch current_global_epoch_local;
  
  uStack_38 = CONCAT17(current_global_epoch.epoch_val,(int7)in_RAX);
  epoch_change_barrier_and_handle_orphans(this,single_thread_mode);
  word = (this->state).super___atomic_base<unsigned_long>._M_i;
  do {
    if (((uint)(word >> 0x20) & 0x3fffffff) < ((uint)word & 0x3fffffff)) {
LAB_00117e2b:
      __assert_fail("threads_in_previous <= thread_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                    ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
    }
    bVar1 = detail::qsbr_epoch::operator==
                      ((qsbr_epoch *)((long)&uStack_38 + 7),(qsbr_epoch)(epoch_type)(word >> 0x3e));
    if (!bVar1) {
      __assert_fail("current_global_epoch == qsbr_state::get_epoch(old_state)",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.cpp"
                    ,0x1f9,"detail::qsbr_epoch unodb::qsbr::change_epoch(detail::qsbr_epoch, bool)")
      ;
    }
    tVar3 = qsbr_state::inc_epoch_reset_previous(word);
    LOCK();
    _Var4 = (this->state).super___atomic_base<unsigned_long>._M_i;
    bVar1 = word == _Var4;
    if (bVar1) {
      (this->state).super___atomic_base<unsigned_long>._M_i = tVar3;
      _Var4 = word;
    }
    UNLOCK();
    if (bVar1) {
      if (3 < uStack_38._7_1_) {
LAB_00117e4a:
        __assert_fail("epoch_val <= max",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                      ,0x9c,"void unodb::detail::qsbr_epoch::assert_invariant() const");
      }
      uStack_38 = CONCAT17(uStack_38._7_1_,CONCAT16(uStack_38._7_1_ + 1,(undefined6)uStack_38)) &
                  0xff03ffffffffffff;
      if (((uint)(tVar3 >> 0x20) & 0x3fffffff) < ((uint)tVar3 & 0x3fffffff)) goto LAB_00117e2b;
      bVar2 = detail::qsbr_epoch::operator==
                        ((qsbr_epoch *)((long)&uStack_38 + 6),
                         (qsbr_epoch)(epoch_type)(tVar3 >> 0x3e));
      if (!bVar2) {
        __assert_fail("current_global_epoch.advance() == qsbr_state::get_epoch(new_state)",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.cpp"
                      ,0x200,
                      "detail::qsbr_epoch unodb::qsbr::change_epoch(detail::qsbr_epoch, bool)");
      }
      (this->epoch_change_count).super___atomic_base<unsigned_long>._M_i =
           (this->epoch_change_count).super___atomic_base<unsigned_long>._M_i + 1;
      if (3 < uStack_38._7_1_) goto LAB_00117e4a;
      unaff_R13B = uStack_38._7_1_ + 1 & 3;
    }
    word = _Var4;
    if (bVar1) {
      return (qsbr_epoch)unaff_R13B;
    }
  } while( true );
}

Assistant:

detail::qsbr_epoch qsbr::change_epoch(detail::qsbr_epoch current_global_epoch,
                                      bool single_thread_mode) noexcept {
  epoch_change_barrier_and_handle_orphans(single_thread_mode);

  auto old_state = state.load(std::memory_order_acquire);
  while (true) {
    UNODB_DETAIL_ASSERT(current_global_epoch ==
                        qsbr_state::get_epoch(old_state));

    const auto new_state = qsbr_state::inc_epoch_reset_previous(old_state);
    if (UNODB_DETAIL_LIKELY(state.compare_exchange_weak(
            old_state, new_state, std::memory_order_acq_rel,
            std::memory_order_acquire))) {
      UNODB_DETAIL_ASSERT(current_global_epoch.advance() ==
                          qsbr_state::get_epoch(new_state));

#ifdef UNODB_DETAIL_WITH_STATS
      bump_epoch_change_count();
#endif  // UNODB_DETAIL_WITH_STATS
      return current_global_epoch.advance();
    }

    // Nobody else can change epoch nor threads in the previous epoch, only
    // allowed failures are thread count change and spurious. The next loop
    // iteration will assert this.
  }
}